

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidPoolingRank1(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  Tensor *obj;
  void *pvVar13;
  PoolingLayerParams *pPVar14;
  ValidPadding *pVVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar19;
  Arena *pAVar20;
  Model m;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b17cf:
    pRVar18 = &(MStack_78.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b17cf;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"A",puVar17);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar2] = 2;
  uVar19 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar19;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar19] = 1;
  uVar19 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar19;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar19 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(this);
  plVar9[uVar19] = 1;
  this->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b1995:
    pRVar18 = &(MStack_78.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b1995;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"B",puVar17);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b1a8c:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b1a8c;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar11->name_,"pool_layer",puVar17);
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b1ae7:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b1ae7;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b8534);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b1b37:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar1 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b1b37;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar13 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3d8b56);
  pRVar4 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar13 = pRVar4->elements[iVar1];
      goto LAB_001b1b9e;
    }
  }
  obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                  ((pNVar11->inputtensor_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->inputtensor_).super_RepeatedPtrFieldBase,obj);
LAB_001b1b9e:
  *(undefined4 *)((long)pvVar13 + 0x24) = 3;
  if (pNVar11->_oneof_case_[0] != 0x78) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x78;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pPVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PoolingLayerParams>
                        (pAVar20);
    (pNVar11->layer_).pooling_ = pPVar14;
  }
  pPVar14 = (pNVar11->layer_).pooling_;
  pPVar14->type_ = 1;
  pPVar14->globalpooling_ = true;
  if (pPVar14->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(pPVar14);
    pPVar14->_oneof_case_[0] = 0x1e;
    uVar5 = (pPVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pVVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ValidPadding>
                        (pAVar20);
    (pPVar14->PoolingPaddingType_).valid_ = pVVar15;
  }
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar6 = CoreML::Result::good(&local_48);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1363);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar6;
}

Assistant:

int testInvalidPoolingRank1() {
    /*
     A -> pooling -> B
     invalid since the rank of the input is 3, in the proto, whereas it should be at least 4.
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l = nn->add_layers();
    l->set_name("pool_layer");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(3);
    auto *params = l->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}